

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_compression_type.cpp
# Opt level: O1

FileCompressionType duckdb::FileCompressionTypeFromString(string *input)

{
  pointer pcVar1;
  int iVar2;
  ParserException *this;
  FileCompressionType FVar3;
  string parameter;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  StringUtil::Lower(&local_88,(string *)input);
  iVar2 = ::std::__cxx11::string::compare((char *)&local_88);
  if (iVar2 != 0) {
    iVar2 = ::std::__cxx11::string::compare((char *)&local_88);
    if (iVar2 != 0) {
      iVar2 = ::std::__cxx11::string::compare((char *)&local_88);
      if (iVar2 == 0) {
        FVar3 = GZIP;
      }
      else {
        iVar2 = ::std::__cxx11::string::compare((char *)&local_88);
        if (iVar2 == 0) {
          FVar3 = ZSTD;
        }
        else {
          iVar2 = ::std::__cxx11::string::compare((char *)&local_88);
          FVar3 = UNCOMPRESSED;
          if (iVar2 != 0) {
            iVar2 = ::std::__cxx11::string::compare((char *)&local_88);
            if ((iVar2 != 0) && (local_88._M_string_length != 0)) {
              this = (ParserException *)__cxa_allocate_exception(0x10);
              local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_48,"Unrecognized file compression type \"%s\"","");
              local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
              pcVar1 = (input->_M_dataplus)._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_68,pcVar1,pcVar1 + input->_M_string_length);
              ParserException::ParserException<std::__cxx11::string>(this,&local_48,&local_68);
              __cxa_throw(this,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
        }
      }
      goto LAB_0125bcf6;
    }
  }
  FVar3 = AUTO_DETECT;
LAB_0125bcf6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return FVar3;
}

Assistant:

FileCompressionType FileCompressionTypeFromString(const string &input) {
	auto parameter = StringUtil::Lower(input);
	if (parameter == "infer" || parameter == "auto") {
		return FileCompressionType::AUTO_DETECT;
	} else if (parameter == "gzip") {
		return FileCompressionType::GZIP;
	} else if (parameter == "zstd") {
		return FileCompressionType::ZSTD;
	} else if (parameter == "uncompressed" || parameter == "none" || parameter.empty()) {
		return FileCompressionType::UNCOMPRESSED;
	} else {
		throw ParserException("Unrecognized file compression type \"%s\"", input);
	}
}